

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O3

void test_bson_iter_trailing_null(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  bson_t *pbVar4;
  undefined4 *puVar5;
  long lVar6;
  undefined8 uVar7;
  undefined1 *puVar8;
  char *pcVar9;
  bson_t *unaff_RBX;
  undefined1 *puVar10;
  undefined8 *puVar11;
  bson_t *pbVar12;
  bson_t *pbVar13;
  bson_t *pbVar14;
  TestSuite *suite;
  ulong uVar15;
  undefined1 *puVar16;
  bson_t *pbVar17;
  ulong uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  bson_iter_t iter;
  undefined1 auStack_2f18 [4104];
  bson_t *pbStack_1f10;
  code *pcStack_1f08;
  undefined8 uStack_1e90;
  undefined1 uStack_1e88;
  TestSuite aTStack_1e80 [5];
  code *pcStack_1d88;
  int *piStack_1d10;
  int iStack_1d08;
  undefined1 auStack_1d04 [4];
  undefined1 auStack_1d00 [232];
  bson_t *pbStack_1c18;
  undefined1 *puStack_1c10;
  code *pcStack_1c08;
  bson_t bStack_1c00;
  bson_t abStack_1b80 [2];
  undefined8 uStack_1a48;
  char *pcStack_1a40;
  bson_t *pbStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  bson_t *pbStack_1a20;
  char *pcStack_1a18;
  char *pcStack_1a10;
  code *pcStack_1a08;
  undefined1 auStack_1a00 [128];
  undefined1 auStack_1980 [232];
  undefined1 *puStack_1898;
  undefined1 *puStack_1890;
  code *pcStack_1888;
  undefined1 auStack_1880 [128];
  undefined1 auStack_1800 [368];
  undefined1 *puStack_1690;
  code *pcStack_1688;
  undefined1 auStack_1680 [128];
  undefined1 auStack_1600 [128];
  undefined1 auStack_1580 [128];
  undefined1 auStack_1500 [368];
  undefined8 *puStack_1390;
  code *apcStack_1388 [13];
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined1 auStack_1310 [16];
  undefined8 auStack_1300 [14];
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined1 auStack_1280 [360];
  undefined1 *puStack_1118;
  undefined1 *puStack_1110;
  code *pcStack_1108;
  undefined1 auStack_1100 [128];
  undefined1 auStack_1080 [368];
  undefined1 *puStack_f10;
  code *pcStack_f08;
  undefined1 auStack_f00 [128];
  undefined1 auStack_e80 [368];
  undefined1 *puStack_d10;
  code *pcStack_d08;
  undefined1 auStack_d00 [128];
  undefined1 auStack_c80 [368];
  undefined1 *puStack_b10;
  code *pcStack_b08;
  undefined1 auStack_b00 [128];
  undefined1 auStack_a80 [368];
  undefined1 *puStack_910;
  code *pcStack_908;
  undefined1 auStack_900 [128];
  undefined1 auStack_880 [368];
  undefined1 *puStack_710;
  code *pcStack_708;
  undefined1 auStack_700 [128];
  undefined1 auStack_680 [368];
  undefined8 uStack_510;
  code *pcStack_508;
  undefined1 auStack_500 [224];
  undefined8 uStack_420;
  undefined1 *puStack_418;
  undefined8 uStack_410;
  code *pcStack_408;
  undefined1 auStack_400 [240];
  undefined1 *puStack_310;
  code *apcStack_308 [15];
  uint uStack_28c;
  uint *puStack_288;
  undefined1 auStack_280 [8];
  uint uStack_278;
  int iStack_274;
  uint uStack_258;
  bson_t *pbStack_130;
  code *pcStack_108;
  undefined1 auStack_100 [240];
  
  pcStack_108 = (code *)0x12ab2c;
  pbVar4 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/trailingnull.bson"
                   );
  if (pbVar4 == (bson_t *)0x0) {
    pcStack_108 = (code *)0x12ab63;
    test_bson_iter_trailing_null_cold_3();
  }
  else {
    pcStack_108 = (code *)0x12ab3f;
    cVar1 = bson_iter_init(auStack_100,pbVar4);
    unaff_RBX = pbVar4;
    if (cVar1 != '\0') {
      pcStack_108 = (code *)0x12ab4b;
      cVar1 = bson_iter_next(auStack_100);
      if (cVar1 == '\0') {
        pcStack_108 = (code *)0x12ab57;
        bson_destroy(pbVar4);
        return;
      }
      goto LAB_0012ab68;
    }
  }
  pcStack_108 = (code *)0x12ab68;
  test_bson_iter_trailing_null_cold_1();
LAB_0012ab68:
  pcStack_108 = test_bson_iter_fuzz;
  test_bson_iter_trailing_null_cold_2();
  puVar16 = (undefined1 *)0x0;
  uVar18 = 0xfff66;
  pbStack_130 = unaff_RBX;
  pcStack_108 = (code *)&stack0xfffffffffffffff8;
  do {
    apcStack_308[0] = (code *)0x12aba0;
    puVar5 = (undefined4 *)bson_malloc0(0x200);
    *puVar5 = 0x200;
    uVar15 = 0;
    do {
      apcStack_308[0] = (code *)0x12abb1;
      iVar2 = rand();
      *(int *)((long)puVar5 + uVar15 + 4) = iVar2;
      uVar15 = uVar15 + 4;
    } while (uVar15 < 0x1fc);
    apcStack_308[0] = (code *)0x12abd0;
    lVar6 = bson_new_from_data(puVar5,0x200);
    if (lVar6 != 0) {
      apcStack_308[0] = (code *)0x12abe7;
      cVar1 = bson_iter_init(auStack_280,lVar6);
      if (cVar1 == '\0') {
LAB_0012ad0b:
        apcStack_308[0] = (code *)0x12ad10;
        test_bson_iter_fuzz_cold_1();
LAB_0012ad10:
        apcStack_308[0] = (code *)0x12ad15;
        test_bson_iter_fuzz_cold_8();
LAB_0012ad15:
        apcStack_308[0] = (code *)0x12ad1a;
        test_bson_iter_fuzz_cold_4();
LAB_0012ad1a:
        apcStack_308[0] = (code *)0x12ad1f;
        test_bson_iter_fuzz_cold_5();
LAB_0012ad1f:
        apcStack_308[0] = (code *)0x12ad24;
        test_bson_iter_fuzz_cold_7();
LAB_0012ad24:
        apcStack_308[0] = (code *)0x12ad29;
        test_bson_iter_fuzz_cold_6();
LAB_0012ad29:
        apcStack_308[0] = (code *)0x12ad2e;
        test_bson_iter_fuzz_cold_3();
LAB_0012ad2e:
        apcStack_308[0] = test_bson_iter_regex;
        test_bson_iter_fuzz_cold_9();
        pcStack_408 = (code *)0x12ad48;
        puStack_310 = auStack_280;
        apcStack_308[0] = (code *)&pcStack_108;
        uVar7 = bson_new();
        pcStack_408 = (code *)0x12ad6d;
        cVar1 = bson_append_regex(uVar7,"foo",0xffffffff,"^abcd","");
        if (cVar1 == '\0') {
          pcStack_408 = (code *)0x12ae04;
          test_bson_iter_regex_cold_1();
LAB_0012ae04:
          pcStack_408 = (code *)0x12ae09;
          test_bson_iter_regex_cold_2();
LAB_0012ae09:
          pcStack_408 = (code *)0x12ae0e;
          test_bson_iter_regex_cold_3();
LAB_0012ae0e:
          pcStack_408 = (code *)0x12ae13;
          test_bson_iter_regex_cold_4();
LAB_0012ae13:
          pcStack_408 = (code *)0x12ae18;
          test_bson_iter_regex_cold_5();
LAB_0012ae18:
          pcStack_408 = (code *)0x12ae1d;
          test_bson_iter_regex_cold_6();
        }
        else {
          pcStack_408 = (code *)0x12ad93;
          cVar1 = bson_append_regex(uVar7,"foo",0xffffffff,"^abcd",0);
          if (cVar1 == '\0') goto LAB_0012ae04;
          pcStack_408 = (code *)0x12adb9;
          cVar1 = bson_append_regex(uVar7,"foo",0xffffffff,"^abcd","ix");
          if (cVar1 == '\0') goto LAB_0012ae09;
          pcStack_408 = (code *)0x12adc8;
          cVar1 = bson_iter_init(auStack_400,uVar7);
          if (cVar1 == '\0') goto LAB_0012ae0e;
          pcStack_408 = (code *)0x12add4;
          cVar1 = bson_iter_next(auStack_400);
          if (cVar1 == '\0') goto LAB_0012ae13;
          pcStack_408 = (code *)0x12ade0;
          cVar1 = bson_iter_next(auStack_400);
          if (cVar1 == '\0') goto LAB_0012ae18;
          pcStack_408 = (code *)0x12adec;
          cVar1 = bson_iter_next(auStack_400);
          if (cVar1 != '\0') {
            pcStack_408 = (code *)0x12adf8;
            bson_destroy(uVar7);
            return;
          }
        }
        pcStack_408 = test_bson_iter_next_after_finish;
        test_bson_iter_regex_cold_7();
        uStack_410 = 0xfff66;
        pcStack_508 = (code *)0x12ae3b;
        uStack_420 = uVar7;
        puStack_418 = puVar16;
        pcStack_408 = (code *)apcStack_308;
        uVar7 = bson_new();
        pcStack_508 = (code *)0x12ae57;
        cVar1 = bson_append_int32(uVar7,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') goto LAB_0012aea8;
        pcStack_508 = (code *)0x12ae66;
        cVar1 = bson_iter_init(auStack_500,uVar7);
        if (cVar1 == '\0') goto LAB_0012aead;
        pcStack_508 = (code *)0x12ae72;
        cVar1 = bson_iter_next(auStack_500);
        if (cVar1 != '\0') {
          uVar18 = 1000;
          while( true ) {
            pcStack_508 = (code *)0x12ae87;
            cVar1 = bson_iter_next(auStack_500);
            if (cVar1 != '\0') break;
            uVar3 = (int)uVar18 - 1;
            uVar18 = (ulong)uVar3;
            if (uVar3 == 0) {
              pcStack_508 = (code *)0x12ae98;
              bson_destroy(uVar7);
              return;
            }
          }
          pcStack_508 = (code *)0x12aea8;
          test_bson_iter_next_after_finish_cold_4();
          puVar16 = auStack_500;
LAB_0012aea8:
          pcStack_508 = (code *)0x12aead;
          test_bson_iter_next_after_finish_cold_1();
LAB_0012aead:
          pcStack_508 = (code *)0x12aeb2;
          test_bson_iter_next_after_finish_cold_2();
        }
        pcStack_508 = test_bson_iter_find_case;
        test_bson_iter_next_after_finish_cold_3();
        pcStack_708 = (code *)0x12aed7;
        uStack_510 = uVar7;
        pcStack_508 = (code *)&pcStack_408;
        bson_init(auStack_680);
        pcStack_708 = (code *)0x12aef8;
        cVar1 = bson_append_utf8(auStack_680,"key",0xffffffff,"value",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_708 = (code *)0x12af63;
          test_bson_iter_find_case_cold_1();
LAB_0012af63:
          pcStack_708 = (code *)0x12af68;
          test_bson_iter_find_case_cold_2();
LAB_0012af68:
          pcStack_708 = (code *)0x12af6d;
          test_bson_iter_find_case_cold_3();
LAB_0012af6d:
          pcStack_708 = (code *)0x12af72;
          test_bson_iter_find_case_cold_4();
        }
        else {
          pcStack_708 = (code *)0x12af0c;
          cVar1 = bson_iter_init(auStack_700,auStack_680);
          if (cVar1 == '\0') goto LAB_0012af63;
          pcStack_708 = (code *)0x12af1f;
          cVar1 = bson_iter_find_case(auStack_700,"KEY");
          if (cVar1 == '\0') goto LAB_0012af68;
          pcStack_708 = (code *)0x12af33;
          cVar1 = bson_iter_init(auStack_700,auStack_680);
          if (cVar1 == '\0') goto LAB_0012af6d;
          pcStack_708 = (code *)0x12af46;
          cVar1 = bson_iter_find(auStack_700,"KEY");
          if (cVar1 == '\0') {
            pcStack_708 = (code *)0x12af57;
            bson_destroy(auStack_680);
            return;
          }
        }
        pcStack_708 = test_bson_iter_as_double;
        test_bson_iter_find_case_cold_5();
        pcStack_908 = (code *)0x12af97;
        puStack_710 = auStack_680;
        pcStack_708 = (code *)&pcStack_508;
        bson_init(auStack_880);
        pcStack_908 = (code *)0x12afb3;
        cVar1 = bson_append_double(0x4093487e5c91d14e,auStack_880,"key",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_908 = (code *)0x12b116;
          test_bson_iter_as_double_cold_1();
LAB_0012b116:
          pcStack_908 = (code *)0x12b11b;
          test_bson_iter_as_double_cold_2();
LAB_0012b11b:
          pcStack_908 = (code *)0x12b120;
          test_bson_iter_as_double_cold_3();
LAB_0012b120:
          pcStack_908 = (code *)0x12b125;
          test_bson_iter_as_double_cold_4();
LAB_0012b125:
          pcStack_908 = (code *)0x12b12a;
          test_bson_iter_as_double_cold_5();
LAB_0012b12a:
          pcStack_908 = (code *)0x12b12f;
          test_bson_iter_as_double_cold_6();
LAB_0012b12f:
          pcStack_908 = (code *)0x12b134;
          test_bson_iter_as_double_cold_7();
LAB_0012b134:
          pcStack_908 = (code *)0x12b139;
          test_bson_iter_as_double_cold_8();
LAB_0012b139:
          pcStack_908 = (code *)0x12b13e;
          test_bson_iter_as_double_cold_9();
LAB_0012b13e:
          pcStack_908 = (code *)0x12b143;
          test_bson_iter_as_double_cold_10();
LAB_0012b143:
          pcStack_908 = (code *)0x12b148;
          test_bson_iter_as_double_cold_11();
        }
        else {
          pcStack_908 = (code *)0x12afd2;
          cVar1 = bson_iter_init_find(auStack_900,auStack_880,"key");
          if (cVar1 == '\0') goto LAB_0012b116;
          pcStack_908 = (code *)0x12afe2;
          iVar2 = bson_iter_type(auStack_900);
          if (iVar2 != 1) goto LAB_0012b11b;
          pcStack_908 = (code *)0x12aff3;
          dVar19 = (double)bson_iter_as_double(auStack_900);
          if ((dVar19 != 1234.1234) || (NAN(dVar19))) goto LAB_0012b120;
          pcStack_908 = (code *)0x12b017;
          bson_destroy(auStack_880);
          pcStack_908 = (code *)0x12b01f;
          bson_init(auStack_880);
          pcStack_908 = (code *)0x12b038;
          cVar1 = bson_append_int32(auStack_880,"key",0xffffffff,0x4d2);
          if (cVar1 == '\0') goto LAB_0012b125;
          pcStack_908 = (code *)0x12b057;
          cVar1 = bson_iter_init_find(auStack_900,auStack_880,"key");
          if (cVar1 == '\0') goto LAB_0012b12a;
          pcStack_908 = (code *)0x12b067;
          iVar2 = bson_iter_type(auStack_900);
          if (iVar2 != 0x10) goto LAB_0012b12f;
          pcStack_908 = (code *)0x12b078;
          dVar19 = (double)bson_iter_as_double(auStack_900);
          if ((dVar19 != 1234.0) || (NAN(dVar19))) goto LAB_0012b134;
          pcStack_908 = (code *)0x12b09c;
          bson_destroy(auStack_880);
          pcStack_908 = (code *)0x12b0a4;
          bson_init(auStack_880);
          pcStack_908 = (code *)0x12b0bd;
          cVar1 = bson_append_int64(auStack_880,"key",0xffffffff,0x10e1);
          if (cVar1 == '\0') goto LAB_0012b139;
          pcStack_908 = (code *)0x12b0d8;
          cVar1 = bson_iter_init_find(auStack_900,auStack_880,"key");
          if (cVar1 == '\0') goto LAB_0012b13e;
          pcStack_908 = (code *)0x12b0e4;
          iVar2 = bson_iter_type(auStack_900);
          if (iVar2 != 0x12) goto LAB_0012b143;
          pcStack_908 = (code *)0x12b0f1;
          dVar19 = (double)bson_iter_as_double(auStack_900);
          if ((dVar19 == 4321.0) && (!NAN(dVar19))) {
            pcStack_908 = (code *)0x12b10a;
            bson_destroy(auStack_880);
            return;
          }
        }
        pcStack_908 = test_bson_iter_overwrite_int32;
        test_bson_iter_as_double_cold_12();
        puVar8 = auStack_a80;
        pcStack_b08 = (code *)0x12b16d;
        puStack_910 = auStack_880;
        pcStack_908 = (code *)&pcStack_708;
        bson_init(puVar8);
        pcStack_b08 = (code *)0x12b186;
        cVar1 = bson_append_int32(puVar8,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_b08 = (code *)0x12b216;
          test_bson_iter_overwrite_int32_cold_1();
LAB_0012b216:
          pcStack_b08 = (code *)0x12b21b;
          test_bson_iter_overwrite_int32_cold_2();
LAB_0012b21b:
          pcStack_b08 = (code *)0x12b220;
          test_bson_iter_overwrite_int32_cold_3();
LAB_0012b220:
          pcStack_b08 = (code *)0x12b225;
          test_bson_iter_overwrite_int32_cold_4();
LAB_0012b225:
          pcStack_b08 = (code *)0x12b22a;
          test_bson_iter_overwrite_int32_cold_5();
        }
        else {
          pcStack_b08 = (code *)0x12b1a5;
          cVar1 = bson_iter_init_find(auStack_b00,auStack_a80,"key");
          if (cVar1 == '\0') goto LAB_0012b216;
          pcStack_b08 = (code *)0x12b1b1;
          iVar2 = bson_iter_type(auStack_b00);
          if (iVar2 != 0x10) goto LAB_0012b21b;
          pcStack_b08 = (code *)0x12b1c6;
          bson_iter_overwrite_int32(auStack_b00,0x10e1);
          pcStack_b08 = (code *)0x12b1dd;
          cVar1 = bson_iter_init_find(auStack_b00,auStack_a80,"key");
          puVar8 = auStack_b00;
          if (cVar1 == '\0') goto LAB_0012b220;
          pcStack_b08 = (code *)0x12b1e9;
          iVar2 = bson_iter_type(auStack_b00);
          puVar8 = auStack_b00;
          if (iVar2 != 0x10) goto LAB_0012b225;
          pcStack_b08 = (code *)0x12b1f6;
          iVar2 = bson_iter_int32(auStack_b00);
          puVar8 = auStack_b00;
          if (iVar2 == 0x10e1) {
            pcStack_b08 = (code *)0x12b20a;
            bson_destroy(auStack_a80);
            return;
          }
        }
        pcStack_b08 = test_bson_iter_overwrite_int64;
        test_bson_iter_overwrite_int32_cold_6();
        puVar10 = auStack_c80;
        pcStack_d08 = (code *)0x12b24f;
        puStack_b10 = puVar8;
        pcStack_b08 = (code *)&pcStack_908;
        bson_init(puVar10);
        pcStack_d08 = (code *)0x12b268;
        cVar1 = bson_append_int64(puVar10,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_d08 = (code *)0x12b2f9;
          test_bson_iter_overwrite_int64_cold_1();
LAB_0012b2f9:
          pcStack_d08 = (code *)0x12b2fe;
          test_bson_iter_overwrite_int64_cold_2();
LAB_0012b2fe:
          pcStack_d08 = (code *)0x12b303;
          test_bson_iter_overwrite_int64_cold_3();
LAB_0012b303:
          pcStack_d08 = (code *)0x12b308;
          test_bson_iter_overwrite_int64_cold_4();
LAB_0012b308:
          pcStack_d08 = (code *)0x12b30d;
          test_bson_iter_overwrite_int64_cold_5();
        }
        else {
          pcStack_d08 = (code *)0x12b287;
          cVar1 = bson_iter_init_find(auStack_d00,auStack_c80,"key");
          if (cVar1 == '\0') goto LAB_0012b2f9;
          pcStack_d08 = (code *)0x12b293;
          iVar2 = bson_iter_type(auStack_d00);
          if (iVar2 != 0x12) goto LAB_0012b2fe;
          pcStack_d08 = (code *)0x12b2a8;
          bson_iter_overwrite_int64(auStack_d00,0x1221);
          pcStack_d08 = (code *)0x12b2bf;
          cVar1 = bson_iter_init_find(auStack_d00,auStack_c80,"key");
          puVar10 = auStack_d00;
          if (cVar1 == '\0') goto LAB_0012b303;
          pcStack_d08 = (code *)0x12b2cb;
          iVar2 = bson_iter_type(auStack_d00);
          puVar10 = auStack_d00;
          if (iVar2 != 0x12) goto LAB_0012b308;
          pcStack_d08 = (code *)0x12b2d8;
          lVar6 = bson_iter_int64(auStack_d00);
          puVar10 = auStack_d00;
          if (lVar6 == 0x1221) {
            pcStack_d08 = (code *)0x12b2ed;
            bson_destroy(auStack_c80);
            return;
          }
        }
        pcStack_d08 = test_bson_iter_overwrite_double;
        test_bson_iter_overwrite_int64_cold_6();
        puVar8 = auStack_e80;
        pcStack_f08 = (code *)0x12b332;
        puStack_d10 = puVar10;
        pcStack_d08 = (code *)&pcStack_b08;
        bson_init(puVar8);
        pcStack_f08 = (code *)0x12b34e;
        cVar1 = bson_append_double(0x4093487e5c91d14e,puVar8,"key",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_f08 = (code *)0x12b3e6;
          test_bson_iter_overwrite_double_cold_1();
LAB_0012b3e6:
          pcStack_f08 = (code *)0x12b3eb;
          test_bson_iter_overwrite_double_cold_2();
LAB_0012b3eb:
          pcStack_f08 = (code *)0x12b3f0;
          test_bson_iter_overwrite_double_cold_3();
LAB_0012b3f0:
          pcStack_f08 = (code *)0x12b3f5;
          test_bson_iter_overwrite_double_cold_4();
LAB_0012b3f5:
          pcStack_f08 = (code *)0x12b3fa;
          test_bson_iter_overwrite_double_cold_5();
        }
        else {
          pcStack_f08 = (code *)0x12b36d;
          cVar1 = bson_iter_init_find(auStack_f00,auStack_e80,"key");
          if (cVar1 == '\0') goto LAB_0012b3e6;
          pcStack_f08 = (code *)0x12b379;
          iVar2 = bson_iter_type(auStack_f00);
          if (iVar2 != 1) goto LAB_0012b3eb;
          pcStack_f08 = (code *)0x12b391;
          bson_iter_overwrite_double(0x40b2211f97247454,auStack_f00);
          pcStack_f08 = (code *)0x12b3a8;
          cVar1 = bson_iter_init_find(auStack_f00,auStack_e80,"key");
          puVar8 = auStack_f00;
          if (cVar1 == '\0') goto LAB_0012b3f0;
          pcStack_f08 = (code *)0x12b3b4;
          iVar2 = bson_iter_type(auStack_f00);
          puVar8 = auStack_f00;
          if (iVar2 != 1) goto LAB_0012b3f5;
          pcStack_f08 = (code *)0x12b3c1;
          dVar19 = (double)bson_iter_double(auStack_f00);
          puVar8 = auStack_f00;
          if ((dVar19 == 4641.1234) && (puVar8 = auStack_f00, !NAN(dVar19))) {
            pcStack_f08 = (code *)0x12b3da;
            bson_destroy(auStack_e80);
            return;
          }
        }
        pcStack_f08 = test_bson_iter_overwrite_bool;
        test_bson_iter_overwrite_double_cold_6();
        puVar10 = auStack_1080;
        pcStack_1108 = (code *)0x12b41f;
        puStack_f10 = puVar8;
        pcStack_f08 = (code *)&pcStack_d08;
        bson_init(puVar10);
        pcStack_1108 = (code *)0x12b438;
        cVar1 = bson_append_bool(puVar10,"key",0xffffffff,1);
        if (cVar1 == '\0') {
          pcStack_1108 = (code *)0x12b4be;
          test_bson_iter_overwrite_bool_cold_1();
LAB_0012b4be:
          pcStack_1108 = (code *)0x12b4c3;
          test_bson_iter_overwrite_bool_cold_2();
LAB_0012b4c3:
          pcStack_1108 = (code *)0x12b4c8;
          test_bson_iter_overwrite_bool_cold_3();
LAB_0012b4c8:
          pcStack_1108 = (code *)0x12b4cd;
          test_bson_iter_overwrite_bool_cold_4();
LAB_0012b4cd:
          pcStack_1108 = (code *)0x12b4d2;
          test_bson_iter_overwrite_bool_cold_5();
        }
        else {
          pcStack_1108 = (code *)0x12b453;
          cVar1 = bson_iter_init_find(auStack_1100,auStack_1080,"key");
          if (cVar1 == '\0') goto LAB_0012b4be;
          pcStack_1108 = (code *)0x12b45f;
          iVar2 = bson_iter_type(auStack_1100);
          if (iVar2 != 8) goto LAB_0012b4c3;
          pcStack_1108 = (code *)0x12b471;
          bson_iter_overwrite_bool(auStack_1100,0);
          pcStack_1108 = (code *)0x12b488;
          cVar1 = bson_iter_init_find(auStack_1100,auStack_1080,"key");
          puVar10 = auStack_1100;
          if (cVar1 == '\0') goto LAB_0012b4c8;
          pcStack_1108 = (code *)0x12b494;
          iVar2 = bson_iter_type(auStack_1100);
          puVar10 = auStack_1100;
          if (iVar2 != 8) goto LAB_0012b4cd;
          pcStack_1108 = (code *)0x12b4a1;
          cVar1 = bson_iter_bool(auStack_1100);
          puVar10 = auStack_1100;
          if (cVar1 == '\0') {
            pcStack_1108 = (code *)0x12b4b2;
            bson_destroy(auStack_1080);
            return;
          }
        }
        pcStack_1108 = test_bson_iter_overwrite_decimal128;
        test_bson_iter_overwrite_bool_cold_6();
        puVar11 = &uStack_1290;
        uStack_1288 = 0;
        uStack_1290 = 1;
        uStack_1318 = 0;
        uStack_1320 = 2;
        puVar8 = auStack_1280;
        apcStack_1388[0] = (code *)0x12b51c;
        puStack_1118 = puVar10;
        puStack_1110 = puVar16;
        pcStack_1108 = (code *)&pcStack_f08;
        bson_init(puVar8);
        apcStack_1388[0] = (code *)0x12b533;
        cVar1 = bson_append_decimal128(puVar8,"key",0xffffffff,puVar11);
        if (cVar1 == '\0') {
          apcStack_1388[0] = (code *)0x12b603;
          test_bson_iter_overwrite_decimal128_cold_1();
LAB_0012b603:
          apcStack_1388[0] = (code *)0x12b608;
          test_bson_iter_overwrite_decimal128_cold_2();
LAB_0012b608:
          apcStack_1388[0] = (code *)0x12b60d;
          test_bson_iter_overwrite_decimal128_cold_3();
LAB_0012b60d:
          apcStack_1388[0] = (code *)0x12b612;
          test_bson_iter_overwrite_decimal128_cold_4();
LAB_0012b612:
          apcStack_1388[0] = (code *)0x12b617;
          test_bson_iter_overwrite_decimal128_cold_5();
LAB_0012b617:
          apcStack_1388[0] = (code *)0x12b61c;
          test_bson_iter_overwrite_decimal128_cold_6();
        }
        else {
          apcStack_1388[0] = (code *)0x12b557;
          cVar1 = bson_iter_init_find(auStack_1300,auStack_1280,"key");
          if (cVar1 == '\0') goto LAB_0012b603;
          apcStack_1388[0] = (code *)0x12b56c;
          iVar2 = bson_iter_type(auStack_1300);
          if (iVar2 != 0x13) goto LAB_0012b608;
          puVar11 = auStack_1300;
          apcStack_1388[0] = (code *)0x12b58a;
          bson_iter_overwrite_decimal128(puVar11,&uStack_1320);
          apcStack_1388[0] = (code *)0x12b5a1;
          cVar1 = bson_iter_init_find(puVar11,auStack_1280,"key");
          if (cVar1 == '\0') goto LAB_0012b60d;
          apcStack_1388[0] = (code *)0x12b5b2;
          iVar2 = bson_iter_type(auStack_1300);
          if (iVar2 != 0x13) goto LAB_0012b612;
          apcStack_1388[0] = (code *)0x12b5c9;
          cVar1 = bson_iter_decimal128(auStack_1300,auStack_1310);
          if (cVar1 == '\0') goto LAB_0012b617;
          auVar20[0] = -((char)uStack_1320 == auStack_1310[0]);
          auVar20[1] = -(uStack_1320._1_1_ == auStack_1310[1]);
          auVar20[2] = -(uStack_1320._2_1_ == auStack_1310[2]);
          auVar20[3] = -(uStack_1320._3_1_ == auStack_1310[3]);
          auVar20[4] = -(uStack_1320._4_1_ == auStack_1310[4]);
          auVar20[5] = -(uStack_1320._5_1_ == auStack_1310[5]);
          auVar20[6] = -(uStack_1320._6_1_ == auStack_1310[6]);
          auVar20[7] = -(uStack_1320._7_1_ == auStack_1310[7]);
          auVar20[8] = -((char)uStack_1318 == auStack_1310[8]);
          auVar20[9] = -(uStack_1318._1_1_ == auStack_1310[9]);
          auVar20[10] = -(uStack_1318._2_1_ == auStack_1310[10]);
          auVar20[0xb] = -(uStack_1318._3_1_ == auStack_1310[0xb]);
          auVar20[0xc] = -(uStack_1318._4_1_ == auStack_1310[0xc]);
          auVar20[0xd] = -(uStack_1318._5_1_ == auStack_1310[0xd]);
          auVar20[0xe] = -(uStack_1318._6_1_ == auStack_1310[0xe]);
          auVar20[0xf] = -(uStack_1318._7_1_ == auStack_1310[0xf]);
          if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
            apcStack_1388[0] = (code *)0x12b5f5;
            bson_destroy(auStack_1280);
            return;
          }
        }
        apcStack_1388[0] = test_bson_iter_recurse;
        test_bson_iter_overwrite_decimal128_cold_7();
        pcStack_1688 = (code *)0x12b63e;
        puStack_1390 = puVar11;
        apcStack_1388[0] = (code *)&pcStack_1108;
        bson_init(auStack_1500);
        pcStack_1688 = (code *)0x12b64e;
        bson_init(auStack_1600);
        pcStack_1688 = (code *)0x12b664;
        cVar1 = bson_append_int32(auStack_1600,"0",1,0);
        if (cVar1 == '\0') {
          pcStack_1688 = (code *)0x12b79e;
          test_bson_iter_recurse_cold_1();
LAB_0012b79e:
          pcStack_1688 = (code *)0x12b7a3;
          test_bson_iter_recurse_cold_2();
LAB_0012b7a3:
          pcStack_1688 = (code *)0x12b7a8;
          test_bson_iter_recurse_cold_3();
LAB_0012b7a8:
          pcStack_1688 = (code *)0x12b7ad;
          test_bson_iter_recurse_cold_4();
LAB_0012b7ad:
          pcStack_1688 = (code *)0x12b7b2;
          test_bson_iter_recurse_cold_5();
LAB_0012b7b2:
          pcStack_1688 = (code *)0x12b7b7;
          test_bson_iter_recurse_cold_6();
LAB_0012b7b7:
          pcStack_1688 = (code *)0x12b7bc;
          test_bson_iter_recurse_cold_7();
LAB_0012b7bc:
          pcStack_1688 = (code *)0x12b7c1;
          test_bson_iter_recurse_cold_8();
LAB_0012b7c1:
          pcStack_1688 = (code *)0x12b7c6;
          test_bson_iter_recurse_cold_9();
LAB_0012b7c6:
          pcStack_1688 = (code *)0x12b7cb;
          test_bson_iter_recurse_cold_10();
        }
        else {
          pcStack_1688 = (code *)0x12b68a;
          cVar1 = bson_append_int32(auStack_1600,"1",1,1);
          if (cVar1 == '\0') goto LAB_0012b79e;
          pcStack_1688 = (code *)0x12b6b0;
          cVar1 = bson_append_int32(auStack_1600,"2",1,2);
          if (cVar1 == '\0') goto LAB_0012b7a3;
          pcStack_1688 = (code *)0x12b6d9;
          cVar1 = bson_append_array(auStack_1500,"key",0xffffffff,auStack_1600);
          if (cVar1 == '\0') goto LAB_0012b7a8;
          pcStack_1688 = (code *)0x12b6fd;
          cVar1 = bson_iter_init_find(auStack_1580,auStack_1500,"key");
          if (cVar1 == '\0') goto LAB_0012b7ad;
          pcStack_1688 = (code *)0x12b712;
          iVar2 = bson_iter_type(auStack_1580);
          if (iVar2 != 4) goto LAB_0012b7b2;
          pcStack_1688 = (code *)0x12b72b;
          cVar1 = bson_iter_recurse(auStack_1580,auStack_1680);
          if (cVar1 == '\0') goto LAB_0012b7b7;
          pcStack_1688 = (code *)0x12b742;
          cVar1 = bson_iter_find(auStack_1680,"0");
          if (cVar1 == '\0') goto LAB_0012b7bc;
          pcStack_1688 = (code *)0x12b755;
          cVar1 = bson_iter_find(auStack_1680,"1");
          if (cVar1 == '\0') goto LAB_0012b7c1;
          pcStack_1688 = (code *)0x12b768;
          cVar1 = bson_iter_find(auStack_1680,"2");
          if (cVar1 == '\0') goto LAB_0012b7c6;
          pcStack_1688 = (code *)0x12b774;
          cVar1 = bson_iter_next(auStack_1680);
          if (cVar1 == '\0') {
            pcStack_1688 = (code *)0x12b785;
            bson_destroy(auStack_1500);
            pcStack_1688 = (code *)0x12b792;
            bson_destroy(auStack_1600);
            return;
          }
        }
        pcStack_1688 = test_bson_iter_init_find_case;
        test_bson_iter_recurse_cold_11();
        pcStack_1888 = (code *)0x12b7f0;
        puStack_1690 = auStack_1600;
        pcStack_1688 = (code *)apcStack_1388;
        bson_init(auStack_1800);
        pcStack_1888 = (code *)0x12b809;
        cVar1 = bson_append_int32(auStack_1800,"FOO",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_1888 = (code *)0x12b850;
          test_bson_iter_init_find_case_cold_1();
LAB_0012b850:
          pcStack_1888 = (code *)0x12b855;
          test_bson_iter_init_find_case_cold_2();
        }
        else {
          pcStack_1888 = (code *)0x12b824;
          cVar1 = bson_iter_init_find_case(auStack_1880,auStack_1800,"foo");
          if (cVar1 == '\0') goto LAB_0012b850;
          pcStack_1888 = (code *)0x12b830;
          iVar2 = bson_iter_int32(auStack_1880);
          if (iVar2 == 0x4d2) {
            pcStack_1888 = (code *)0x12b844;
            bson_destroy(auStack_1800);
            return;
          }
        }
        pcStack_1888 = test_bson_iter_find_descendant;
        test_bson_iter_init_find_case_cold_3();
        pcStack_1a08 = (code *)0x12b878;
        puStack_1898 = auStack_1800;
        puStack_1890 = puVar8;
        pcStack_1888 = (code *)&pcStack_1688;
        pbVar4 = get_bson(
                         "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                         );
        pcStack_1a08 = (code *)0x12b88b;
        cVar1 = bson_iter_init(auStack_1980,pbVar4);
        if (cVar1 == '\0') {
          pcStack_1a08 = (code *)0x12bab0;
          test_bson_iter_find_descendant_cold_1();
LAB_0012bab0:
          pcStack_1a08 = (code *)0x12bab5;
          test_bson_iter_find_descendant_cold_2();
LAB_0012bab5:
          pcStack_1a08 = (code *)0x12baba;
          test_bson_iter_find_descendant_cold_3();
LAB_0012baba:
          pcStack_1a08 = (code *)0x12babf;
          test_bson_iter_find_descendant_cold_4();
LAB_0012babf:
          pcStack_1a08 = (code *)0x12bac4;
          test_bson_iter_find_descendant_cold_5();
LAB_0012bac4:
          pcStack_1a08 = (code *)0x12bac9;
          test_bson_iter_find_descendant_cold_6();
LAB_0012bac9:
          pcStack_1a08 = (code *)0x12bace;
          test_bson_iter_find_descendant_cold_7();
LAB_0012bace:
          pcStack_1a08 = (code *)0x12bad3;
          test_bson_iter_find_descendant_cold_8();
LAB_0012bad3:
          pcStack_1a08 = (code *)0x12bad8;
          test_bson_iter_find_descendant_cold_9();
LAB_0012bad8:
          pcStack_1a08 = (code *)0x12badd;
          test_bson_iter_find_descendant_cold_10();
LAB_0012badd:
          pcStack_1a08 = (code *)0x12bae2;
          test_bson_iter_find_descendant_cold_11();
LAB_0012bae2:
          pcStack_1a08 = (code *)0x12bae7;
          test_bson_iter_find_descendant_cold_12();
LAB_0012bae7:
          pcStack_1a08 = (code *)0x12baec;
          test_bson_iter_find_descendant_cold_13();
        }
        else {
          pcStack_1a08 = (code *)0x12b8aa;
          cVar1 = bson_iter_find_descendant(auStack_1980,"a.b.c.0",auStack_1a00);
          if (cVar1 == '\0') goto LAB_0012bab0;
          pcStack_1a08 = (code *)0x12b8ba;
          iVar2 = bson_iter_type(auStack_1a00);
          if (iVar2 != 0x10) goto LAB_0012bab5;
          pcStack_1a08 = (code *)0x12b8cb;
          iVar2 = bson_iter_int32(auStack_1a00);
          if (iVar2 != 1) goto LAB_0012baba;
          pcStack_1a08 = (code *)0x12b8dc;
          bson_destroy(pbVar4);
          pcStack_1a08 = (code *)0x12b8e1;
          pbVar4 = (bson_t *)bson_bcon_magic();
          pcStack_1a08 = (code *)0x0;
          pcStack_1a10 = "}";
          pcStack_1a18 = "]";
          pbStack_1a20 = (bson_t *)0x14ad57;
          uStack_1a28 = 1;
          uStack_1a30 = 0xf;
          pcStack_1a40 = "baz";
          uStack_1a48 = 0x12b930;
          pbStack_1a38 = pbVar4;
          puVar8 = (undefined1 *)bcon_new(0,"foo","{","bar","[","{");
          pcStack_1a08 = (code *)0x12b947;
          cVar1 = bson_iter_init(auStack_1980,puVar8);
          if (cVar1 == '\0') goto LAB_0012babf;
          pcStack_1a08 = (code *)0x12b966;
          cVar1 = bson_iter_find_descendant(auStack_1980,"foo.bar.0.baz",auStack_1a00);
          if (cVar1 == '\0') goto LAB_0012bac4;
          pcStack_1a08 = (code *)0x12b976;
          iVar2 = bson_iter_type(auStack_1a00);
          if (iVar2 != 0x10) goto LAB_0012bac9;
          pcStack_1a08 = (code *)0x12b987;
          iVar2 = bson_iter_int32(auStack_1a00);
          if (iVar2 != 1) goto LAB_0012bace;
          pcStack_1a08 = (code *)0x12b998;
          bson_destroy(puVar8);
          pcStack_1a08 = (code *)0x0;
          pcStack_1a10 = (char *)0x2;
          pcStack_1a18 = (char *)0xf;
          uStack_1a28 = 0x12b9c4;
          pbStack_1a20 = pbVar4;
          puVar8 = (undefined1 *)bcon_new(0,"nModified",pbVar4,0xf,1,"n");
          pcStack_1a08 = (code *)0x12b9db;
          cVar1 = bson_iter_init(auStack_1980,puVar8);
          if (cVar1 == '\0') goto LAB_0012bad3;
          pcStack_1a08 = (code *)0x12b9fa;
          cVar1 = bson_iter_find_descendant(auStack_1980,"n",auStack_1a00);
          if (cVar1 == '\0') goto LAB_0012bad8;
          pcStack_1a08 = (code *)0x12ba0a;
          pcVar9 = (char *)bson_iter_key(auStack_1a00);
          if ((*pcVar9 != 'n') || (pcVar9[1] != '\0')) goto LAB_0012badd;
          pcStack_1a08 = (code *)0x12ba25;
          bson_destroy(puVar8);
          pcStack_1a08 = (code *)0x0;
          pcStack_1a10 = (char *)0x2;
          pcStack_1a18 = (char *)0xf;
          uStack_1a28 = 0x12ba51;
          pbStack_1a20 = pbVar4;
          pbVar4 = (bson_t *)bcon_new(0,"",pbVar4,0xf,1,"n");
          pcStack_1a08 = (code *)0x12ba68;
          cVar1 = bson_iter_init(auStack_1980,pbVar4);
          if (cVar1 == '\0') goto LAB_0012bae2;
          pcStack_1a08 = (code *)0x12ba83;
          cVar1 = bson_iter_find_descendant(auStack_1980,"n",auStack_1a00);
          if (cVar1 == '\0') goto LAB_0012bae7;
          pcStack_1a08 = (code *)0x12ba8f;
          pcVar9 = (char *)bson_iter_key(auStack_1a00);
          if ((*pcVar9 == 'n') && (pcVar9[1] == '\0')) {
            pcStack_1a08 = (code *)0x12baa2;
            bson_destroy(pbVar4);
            return;
          }
        }
        pcStack_1a08 = test_bson_iter_as_bool;
        test_bson_iter_find_descendant_cold_14();
        pbVar13 = &bStack_1c00;
        pbVar14 = &bStack_1c00;
        pbVar17 = &bStack_1c00;
        pbVar12 = abStack_1b80;
        pcStack_1c08 = (code *)0x12bb15;
        pbStack_1a20 = pbVar4;
        pcStack_1a18 = puVar8;
        pcStack_1a10 = (char *)uVar18;
        pcStack_1a08 = (code *)&pcStack_1888;
        bson_init(pbVar12);
        pcStack_1c08 = (code *)0x12bb2e;
        bson_append_int32(pbVar12,"int32[true]",0xffffffff,1);
        pcStack_1c08 = (code *)0x12bb44;
        bson_append_int32(pbVar12,"int32[false]",0xffffffff,0);
        pcStack_1c08 = (code *)0x12bb60;
        bson_append_int64(pbVar12,"int64[true]",0xffffffff,1);
        pcStack_1c08 = (code *)0x12bb79;
        bson_append_int64(pbVar12,"int64[false]",0xffffffff,0);
        pcStack_1c08 = (code *)0x12bb91;
        bson_append_double(0x3ff0000000000000,pbVar12,"int64[true]",0xffffffff);
        pcStack_1c08 = (code *)0x12bba4;
        bson_append_double(pbVar12,"int64[false]",0xffffffff);
        pcStack_1c08 = (code *)0x12bbb2;
        bson_iter_init(&bStack_1c00,pbVar12);
        pcStack_1c08 = (code *)0x12bbba;
        bson_iter_next(&bStack_1c00);
        pcStack_1c08 = (code *)0x12bbc2;
        cVar1 = bson_iter_as_bool(&bStack_1c00);
        if (cVar1 == '\0') {
          pcStack_1c08 = (code *)0x12bc5a;
          test_bson_iter_as_bool_cold_1();
LAB_0012bc5a:
          pcStack_1c08 = (code *)0x12bc5f;
          test_bson_iter_as_bool_cold_6();
LAB_0012bc5f:
          pbVar13 = pbVar12;
          pcStack_1c08 = (code *)0x12bc64;
          test_bson_iter_as_bool_cold_2();
LAB_0012bc64:
          pcStack_1c08 = (code *)0x12bc69;
          test_bson_iter_as_bool_cold_5();
LAB_0012bc69:
          pbVar14 = pbVar13;
          pcStack_1c08 = (code *)0x12bc6e;
          test_bson_iter_as_bool_cold_3();
        }
        else {
          pcStack_1c08 = (code *)0x12bbd5;
          bson_iter_next(&bStack_1c00);
          pcStack_1c08 = (code *)0x12bbdd;
          cVar1 = bson_iter_as_bool(&bStack_1c00);
          pbVar12 = &bStack_1c00;
          if (cVar1 != '\0') goto LAB_0012bc5a;
          pcStack_1c08 = (code *)0x12bbec;
          bson_iter_next(&bStack_1c00);
          pcStack_1c08 = (code *)0x12bbf4;
          cVar1 = bson_iter_as_bool(&bStack_1c00);
          pbVar12 = &bStack_1c00;
          if (cVar1 == '\0') goto LAB_0012bc5f;
          pcStack_1c08 = (code *)0x12bc03;
          bson_iter_next(&bStack_1c00);
          pcStack_1c08 = (code *)0x12bc0b;
          cVar1 = bson_iter_as_bool(&bStack_1c00);
          if (cVar1 != '\0') goto LAB_0012bc64;
          pcStack_1c08 = (code *)0x12bc1a;
          bson_iter_next(&bStack_1c00);
          pcStack_1c08 = (code *)0x12bc22;
          cVar1 = bson_iter_as_bool(&bStack_1c00);
          pbVar13 = &bStack_1c00;
          if (cVar1 == '\0') goto LAB_0012bc69;
          pcStack_1c08 = (code *)0x12bc31;
          bson_iter_next(&bStack_1c00);
          pcStack_1c08 = (code *)0x12bc39;
          cVar1 = bson_iter_as_bool(&bStack_1c00);
          if (cVar1 == '\0') {
            pcStack_1c08 = (code *)0x12bc4a;
            bson_destroy(abStack_1b80);
            return;
          }
        }
        pcStack_1c08 = test_bson_iter_binary_deprecated;
        test_bson_iter_as_bool_cold_4();
        pcStack_1d88 = (code *)0x12bc91;
        pbStack_1c18 = pbVar14;
        puStack_1c10 = (undefined1 *)&bStack_1c00;
        pcStack_1c08 = (code *)&pcStack_1a08;
        pbVar4 = get_bson(
                         "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                         );
        if (pbVar4 == (bson_t *)0x0) {
          pcStack_1d88 = (code *)0x12bd06;
          test_bson_iter_binary_deprecated_cold_5();
LAB_0012bd06:
          pcStack_1d88 = (code *)0x12bd0b;
          test_bson_iter_binary_deprecated_cold_1();
LAB_0012bd0b:
          pcStack_1d88 = (code *)0x12bd10;
          test_bson_iter_binary_deprecated_cold_2();
LAB_0012bd10:
          pcStack_1d88 = (code *)0x12bd15;
          test_bson_iter_binary_deprecated_cold_3();
        }
        else {
          pcStack_1d88 = (code *)0x12bca9;
          cVar1 = bson_iter_init(auStack_1d00,pbVar4);
          pbVar14 = pbVar4;
          if (cVar1 == '\0') goto LAB_0012bd06;
          pcStack_1d88 = (code *)0x12bcba;
          cVar1 = bson_iter_next(auStack_1d00);
          if (cVar1 == '\0') goto LAB_0012bd0b;
          pbVar17 = (bson_t *)&iStack_1d08;
          pcStack_1d88 = (code *)0x12bcdd;
          bson_iter_binary(auStack_1d00,auStack_1d04,pbVar17,&piStack_1d10);
          if (iStack_1d08 != 4) goto LAB_0012bd10;
          if (*piStack_1d10 == 0x34333231) {
            pcStack_1d88 = (code *)0x12bcf8;
            bson_destroy(pbVar4);
            return;
          }
        }
        pcStack_1d88 = test_bson_iter_from_data;
        test_bson_iter_binary_deprecated_cold_4();
        uStack_1e90 = 0x100620800000009;
        uStack_1e88 = 0;
        suite = aTStack_1e80;
        pcStack_1f08 = (code *)0x12bd51;
        pcStack_1d88 = (code *)&pcStack_1c08;
        cVar1 = bson_iter_init_from_data(suite,&uStack_1e90,9);
        if (cVar1 == '\0') {
          pcStack_1f08 = (code *)0x12bd93;
          test_bson_iter_from_data_cold_1();
LAB_0012bd93:
          pcStack_1f08 = (code *)0x12bd98;
          test_bson_iter_from_data_cold_2();
LAB_0012bd98:
          pcStack_1f08 = (code *)0x12bd9d;
          test_bson_iter_from_data_cold_3();
        }
        else {
          suite = aTStack_1e80;
          pcStack_1f08 = (code *)0x12bd62;
          cVar1 = bson_iter_next();
          if (cVar1 == '\0') goto LAB_0012bd93;
          suite = aTStack_1e80;
          pcStack_1f08 = (code *)0x12bd73;
          iVar2 = bson_iter_type();
          if (iVar2 != 8) goto LAB_0012bd98;
          suite = aTStack_1e80;
          pcStack_1f08 = (code *)0x12bd85;
          cVar1 = bson_iter_bool();
          if (cVar1 != '\0') {
            return;
          }
        }
        pcStack_1f08 = get_bson;
        test_bson_iter_from_data_cold_4();
        pbStack_1f10 = pbVar14;
        pcStack_1f08 = (code *)pbVar17;
        iVar2 = open((char *)suite,0);
        if (iVar2 != -1) {
          uVar18 = read(iVar2,auStack_2f18,0x1000);
          if ((long)uVar18 < 0) goto LAB_0012be04;
          if (uVar18 != 0) {
            bson_new_from_data(auStack_2f18,uVar18 & 0xffffffff);
            close(iVar2);
            return;
          }
          get_bson_cold_1();
        }
        get_bson_cold_3();
LAB_0012be04:
        get_bson_cold_2();
        TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
        TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
        TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
        TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
        TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
        TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
        TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
        TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
        TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
        TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
        TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
        TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
        TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
        TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                      test_bson_as_canonical_extended_json_dbpointer);
        TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
        TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
        TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
        TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
        TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
        TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
        TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
        TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
        TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
        TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
        TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
        TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
        TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
        TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
        TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
        TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
        TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
        TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
        TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
        TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
        TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
        TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
        TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
        TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
        TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
        TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
        TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
        TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
        TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
        TestSuite_Add(suite,"/bson/json/read/regex_options_order",
                      test_bson_json_read_regex_options_order);
        TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
        TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
        TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
        TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
        TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
        TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
        TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
        TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
        TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
        TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
        TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
        TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
        TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
        TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
        TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
        TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
        TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
        TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
        TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
        TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
        TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
        TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
        TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
        TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
        TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
        TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
        return;
      }
LAB_0012abef:
      apcStack_308[0] = (code *)0x12abf7;
      cVar1 = bson_iter_next(auStack_280);
      if (cVar1 != '\0') {
        if (uStack_258 < 0x200) {
          apcStack_308[0] = (code *)0x12ac18;
          uVar3 = bson_iter_type(auStack_280);
          if (uVar3 < 0x14) break;
          goto LAB_0012acc1;
        }
        apcStack_308[0] = (code *)0x12ad0b;
        test_bson_iter_fuzz_cold_2();
        goto LAB_0012ad0b;
      }
      apcStack_308[0] = (code *)0x12acdf;
      bson_destroy(lVar6);
    }
    apcStack_308[0] = (code *)0x12ace7;
    bson_free(puVar5);
    uVar3 = (int)puVar16 + 1;
    puVar16 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 100000) {
      return;
    }
  } while( true );
  if ((0xfff66U >> (uVar3 & 0x1f) & 1) == 0) {
    if ((0x18U >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 == 7) {
        if (uStack_278 <= iStack_274 + 0xcU) goto LAB_0012ad29;
      }
      else {
LAB_0012acc1:
        if ((uVar3 != 0x7f) && (uVar3 != 0xff)) goto LAB_0012ad2e;
      }
    }
    else {
      puStack_288 = (uint *)0x0;
      uStack_28c = 0;
      apcStack_308[0] = (code *)0x12ac54;
      bson_iter_document(auStack_280,&uStack_28c,&puStack_288);
      if (uStack_28c != 0) {
        if (puStack_288 == (uint *)0x0) goto LAB_0012ad10;
        if (uStack_28c < 5) goto LAB_0012ad15;
        if (*(uint *)(lVar6 + 4) <= iStack_274 + uStack_28c) goto LAB_0012ad1a;
        if (uStack_28c == 0xffffffff) goto LAB_0012ad1f;
        uStack_28c = *puStack_288;
        if (uStack_28c < 5) goto LAB_0012ad24;
      }
    }
  }
  goto LAB_0012abef;
}

Assistant:

static void
test_bson_iter_trailing_null (void)
{
   bson_iter_t iter;
   bson_t *b;

   b = get_bson (BINARY_DIR "/trailingnull.bson");
   BSON_ASSERT (b);
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (!bson_iter_next (&iter));
   bson_destroy (b);
}